

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpc_and(int n,mpc_fold_t f,...)

{
  char in_AL;
  mpc_parser_t *pmVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar5;
  undefined8 in_R8;
  ulong uVar6;
  void **ppvVar7;
  void **ppvVar8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  uint local_f8;
  void **local_f0;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  pmVar1 = (mpc_parser_t *)calloc(1,0x38);
  pmVar1->name = (char *)0x0;
  pmVar1->type = '\x18';
  pmVar1->retained = '\0';
  (pmVar1->data).repeat.n = n;
  (pmVar1->data).repeat.f = f;
  pvVar2 = malloc((long)n * 8);
  (pmVar1->data).apply_to.d = pvVar2;
  pvVar3 = malloc((long)n * 8 - 8);
  (pmVar1->data).check_with.d = pvVar3;
  uVar4 = 0x10;
  ppvVar8 = &va[0].overflow_arg_area;
  local_f0 = ppvVar8;
  if (0 < n) {
    local_f8 = 0x10;
    uVar5 = 0;
    do {
      if (local_f8 < 0x29) {
        uVar6 = (ulong)local_f8;
        local_f8 = local_f8 + 8;
        ppvVar7 = (void **)((long)local_d8 + uVar6);
        uVar4 = local_f8;
      }
      else {
        local_f0 = ppvVar8 + 1;
        ppvVar7 = ppvVar8;
        ppvVar8 = local_f0;
      }
      *(void **)((long)pvVar2 + uVar5 * 8) = *ppvVar7;
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  if (1 < n) {
    uVar5 = 0;
    do {
      if (uVar4 < 0x29) {
        uVar6 = (ulong)uVar4;
        uVar4 = uVar4 + 8;
        ppvVar8 = (void **)((long)local_d8 + uVar6);
      }
      else {
        ppvVar8 = local_f0;
        local_f0 = local_f0 + 1;
      }
      *(void **)((long)pvVar3 + uVar5 * 8) = *ppvVar8;
      uVar5 = uVar5 + 1;
    } while (n - 1 != uVar5);
  }
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_and(int n, mpc_fold_t f, ...) {

  int i;
  va_list va;

  mpc_parser_t *p = mpc_undefined();

  p->type = MPC_TYPE_AND;
  p->data.and.n = n;
  p->data.and.f = f;
  p->data.and.xs = malloc(sizeof(mpc_parser_t*) * n);
  p->data.and.dxs = malloc(sizeof(mpc_dtor_t) * (n-1));

  va_start(va, f);
  for (i = 0; i < n; i++) {
    p->data.and.xs[i] = va_arg(va, mpc_parser_t*);
  }
  for (i = 0; i < (n-1); i++) {
    p->data.and.dxs[i] = va_arg(va, mpc_dtor_t);
  }
  va_end(va);

  return p;
}